

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfHeaderSetDoubleAttribute(ImfHeader *hdr,char *name,double value)

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<double> *pTVar3;
  double local_38;
  double local_30;
  TypedAttribute<double> local_28;
  
  local_38 = value;
  IVar1 = Imf_3_2::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_2::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_2::TypedAttribute<double>::TypedAttribute(&local_28,&local_38);
    Imf_3_2::Header::insert((Header *)hdr,name,&local_28.super_Attribute);
    Imf_3_2::TypedAttribute<double>::~TypedAttribute(&local_28);
  }
  else {
    local_30 = local_38;
    pTVar3 = Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<double>>((Header *)hdr,name);
    pTVar3->_value = local_30;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetDoubleAttribute (ImfHeader* hdr, const char name[], double value)
{
    try
    {
        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::DoubleAttribute (value));
        }
        else
        {
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::DoubleAttribute> (name)
                .value () = value;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}